

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O3

void __thiscall HighsLpRelaxation::Playground::~Playground(Playground *this)

{
  if (this->iterateStored == true) {
    Highs::getIterate(&this->lp->lpsolver);
    run(this->lp,true);
  }
  return;
}

Assistant:

~Playground() {
      if (iterateStored) {
        lp->getLpSolver().getIterate();
        lp->run();
        // If desired, here is the place to clear the stored iterate
      }
    }